

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_formatter.cpp
# Opt level: O1

size_t __thiscall
bidfx_public_api::price::subject::SubjectFormatter::NumericCharacterEntity::NextDecodedChar
          (NumericCharacterEntity *this,stringstream *ss,string *s,size_t start)

{
  long lVar1;
  ulong uVar2;
  pointer pcVar3;
  char cVar4;
  ulong uVar5;
  ulong uVar6;
  char local_22;
  char local_21;
  
  uVar6 = start + 1;
  uVar2 = s->_M_string_length;
  if (uVar6 < uVar2) {
    pcVar3 = (s->_M_dataplus)._M_p;
    if (pcVar3[uVar6] == '#') {
      uVar6 = start + 2;
      if (uVar2 <= uVar6) goto LAB_001a6019;
      if ((byte)(pcVar3[uVar6] - 0x30U) < 10) {
        uVar6 = start + 3;
        if (uVar2 <= start + 3) goto LAB_001a6019;
        uVar6 = start + 4;
        cVar4 = pcVar3[start + 3];
        if (uVar6 != uVar2 && cVar4 < ':') {
          uVar5 = uVar6;
          do {
            uVar6 = uVar2;
            if (uVar2 == uVar5) goto LAB_001a6019;
            uVar6 = uVar5 + 1;
            cVar4 = pcVar3[uVar5];
          } while ((cVar4 < ':') && (lVar1 = uVar5 - uVar2, uVar5 = uVar6, lVar1 != -1));
        }
        if (cVar4 == ';') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),&local_22,1);
          return uVar6 - 1;
        }
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),&local_21,1);
    return start;
  }
LAB_001a6019:
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar6);
}

Assistant:

size_t SubjectFormatter::NumericCharacterEntity::NextDecodedChar(std::stringstream &ss, std::string s, size_t start)
{
    size_t i = start + 1;
    char c = s.at(i++);

    if (c == '#')
    {
        c = s.at(i++);

        if (c >= '0' && c <= '9')
        {
            int code = c - '0';

            for (c = s.at(i++); c <= '9'; c = s.at(i++))
            {
                if (i == s.length()) { break; }

                code *= 10;
                code += c - '0';
            }

            if (c == ';')
            {
                ss << (char) code;
                return i - 1;
            }
        }
    }

    ss << '&';
    return start;
}